

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O3

shared_ptr<MyCompiler::ConstDefinition> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::ConstDefinition>(RecursiveDescentParser *this)

{
  istream *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Alloc_hider _Var3;
  size_type sVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Number> sVar6;
  shared_ptr<MyCompiler::ConstDefinition> sVar7;
  string local_48;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::ConstDefinition,std::allocator<MyCompiler::ConstDefinition>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,
             (ConstDefinition **)this,(allocator<MyCompiler::ConstDefinition> *)&local_48);
  parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_48);
  sVar4 = local_48._M_string_length;
  _Var3._M_p = local_48._M_dataplus._M_p;
  piVar1 = this->stream;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50);
  *(pointer *)(piVar1 + 0x48) = _Var3._M_p;
  *(size_type *)(piVar1 + 0x50) = sVar4;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    }
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"identifier must be followed by =","");
  except(in_RSI,EQL,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1));
  }
  sVar6 = parse<MyCompiler::Number>((RecursiveDescentParser *)&local_48);
  sVar4 = local_48._M_string_length;
  _Var3._M_p = local_48._M_dataplus._M_p;
  _Var5 = sVar6.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  piVar1 = this->stream;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x60);
  *(pointer *)(piVar1 + 0x58) = _Var3._M_p;
  *(size_type *)(piVar1 + 0x60) = sVar4;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    _Var5._M_pi = extraout_RDX;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
      _Var5._M_pi = extraout_RDX_00;
    }
  }
  sVar7.super___shared_ptr<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  sVar7.super___shared_ptr<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::ConstDefinition>)
         sVar7.super___shared_ptr<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::ConstDefinition> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<ConstDefinition>();

    pResult->pIdent = parse<Ident>();
    except(SymbolType::EQL, "identifier must be followed by =");
    pResult->pNumber = parse<Number>();

    return pResult;
}